

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O1

Vector3 __thiscall pm::Rectangle::sample(Rectangle *this)

{
  float fVar1;
  long in_RSI;
  Vector3 VVar2;
  Vector2 sp;
  float local_20;
  float local_1c;
  
  SamplerState::sampleUnitSquare((SamplerState *)&local_20);
  VVar2.x = local_20 * *(float *)(in_RSI + 0x2c) + *(float *)(in_RSI + 0x20);
  VVar2.y = 0.0;
  VVar2.z = *(float *)(in_RSI + 0x34) * local_1c +
            *(float *)(in_RSI + 0x28) * local_20 + *(float *)(in_RSI + 0x1c);
  fVar1 = *(float *)(in_RSI + 0x38);
  *(float *)&(this->super_Geometry)._vptr_Geometry =
       *(float *)(in_RSI + 0x30) * local_1c +
       *(float *)(in_RSI + 0x24) * local_20 + *(float *)(in_RSI + 0x18);
  *(float *)((long)&(this->super_Geometry)._vptr_Geometry + 4) = VVar2.z;
  (this->super_Geometry).type_ = (Type)(local_1c * fVar1 + VVar2.x);
  return VVar2;
}

Assistant:

Vector3 Rectangle::sample(void) const
{
	Vector2 sp = samplerState_.sampleUnitSquare();
	return Vector3(point_ + sp.x * a_ + sp.y * b_);
}